

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O1

void client_connect(void)

{
  uv_loop_t *server;
  int iVar1;
  code *tcp;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  sockaddr_in addr;
  sockaddr_in local_20;
  
  tcp = (code *)malloc(0xf8);
  puVar2 = (uv_loop_t *)malloc(0x60);
  puVar5 = (uv_loop_t *)0x1a4b5a;
  puVar4 = (uv_loop_t *)0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_20);
  if (iVar1 == 0) {
    if ((uv_loop_t *)tcp == (uv_loop_t *)0x0) goto LAB_0014b658;
    if (puVar2 == (uv_loop_t *)0x0) goto LAB_0014b65d;
    puVar5 = uv_default_loop();
    puVar4 = (uv_loop_t *)tcp;
    iVar1 = uv_tcp_init(puVar5,(uv_tcp_t *)tcp);
    if (iVar1 != 0) goto LAB_0014b662;
    iVar1 = uv_tcp_connect((uv_connect_t *)puVar2,(uv_tcp_t *)tcp,(sockaddr *)&local_20,connect_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    client_connect_cold_1();
LAB_0014b658:
    client_connect_cold_5();
LAB_0014b65d:
    client_connect_cold_4();
LAB_0014b662:
    puVar2 = puVar5;
    tcp = (code *)puVar4;
    client_connect_cold_2();
  }
  client_connect_cold_3();
  if ((int)tcp == 0) {
    puVar4 = (uv_loop_t *)0x98;
    puVar5 = (uv_loop_t *)malloc(0x98);
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_0014b6cd;
    puVar4 = uv_default_loop();
    tcp = (code *)puVar5;
    iVar1 = uv_timer_init(puVar4,(uv_timer_t *)puVar5);
    if (iVar1 != 0) goto LAB_0014b6d2;
    puVar5->data = puVar2;
    tcp = do_accept;
    iVar1 = uv_timer_start((uv_timer_t *)puVar5,do_accept,1000,0);
    if (iVar1 == 0) {
      connection_cb_called = connection_cb_called + 1;
      return;
    }
  }
  else {
    connection_cb_cold_1();
    puVar4 = puVar2;
LAB_0014b6cd:
    connection_cb_cold_4();
LAB_0014b6d2:
    puVar5 = puVar4;
    connection_cb_cold_2();
  }
  connection_cb_cold_3();
  puVar4 = (uv_loop_t *)0xf8;
  puVar2 = (uv_loop_t *)malloc(0xf8);
  if (puVar5 == (uv_loop_t *)0x0) {
    do_accept_cold_4();
LAB_0014b767:
    do_accept_cold_3();
LAB_0014b76c:
    do_accept_cold_1();
  }
  else {
    if (puVar2 == (uv_loop_t *)0x0) goto LAB_0014b767;
    puVar4 = uv_default_loop();
    tcp = (code *)puVar2;
    iVar1 = uv_tcp_init(puVar4,(uv_tcp_t *)puVar2);
    if (iVar1 != 0) goto LAB_0014b76c;
    server = (uv_loop_t *)puVar5->data;
    tcp = (code *)puVar2;
    puVar4 = server;
    iVar1 = uv_accept((uv_stream_t *)server,(uv_stream_t *)puVar2);
    if (iVar1 == 0) {
      do_accept_called = do_accept_called + 1;
      uv_close((uv_handle_t *)puVar2,close_cb);
      if (do_accept_called == 2) {
        uv_close((uv_handle_t *)server,close_cb);
      }
      uv_close((uv_handle_t *)puVar5,close_cb);
      return;
    }
  }
  do_accept_cold_2();
  if (puVar4 != (uv_loop_t *)0x0) {
    free(puVar4);
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  if (puVar4 == (uv_loop_t *)0x0) {
    connect_cb_cold_3();
  }
  else if ((int)tcp == 0) {
    tcp = alloc_cb;
    iVar1 = uv_read_start((uv_stream_t *)puVar4->pending_queue[0],alloc_cb,read_cb);
    if (iVar1 == 0) {
      connect_cb_called = connect_cb_called + 1;
      free(puVar4);
      return;
    }
    goto LAB_0014b7cf;
  }
  connect_cb_cold_1();
LAB_0014b7cf:
  connect_cb_cold_2();
  pvVar3 = malloc((size_t)tcp);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = tcp;
  return;
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(client != NULL);
  ASSERT(connect_req != NULL);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT(r == 0);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);
}